

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O0

int device_initialization(Init *init)

{
  VkInstance pVVar1;
  VkDebugUtilsMessengerEXT pVVar2;
  VkAllocationCallbacks *pVVar3;
  PFN_vkGetInstanceProcAddr p_Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  InstanceBuilder *pIVar8;
  ostream *poVar9;
  Instance *__writefds;
  PhysicalDevice *pPVar10;
  Device *pDVar11;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  error_code eVar12;
  DispatchTable local_3da8;
  error_code local_2a20;
  string local_2a10;
  undefined1 local_29f0 [8];
  Result<vkb::Device> device_ret;
  undefined1 local_1c18 [8];
  DeviceBuilder device_builder;
  PhysicalDevice physical_device;
  string local_e48;
  undefined1 local_e28 [8];
  Result<vkb::PhysicalDevice> phys_device_ret;
  PhysicalDeviceSelector phys_device_selector;
  error_code local_180;
  string local_170;
  undefined1 local_140 [8];
  Result<vkb::Instance> instance_ret;
  InstanceBuilder instance_builder;
  Init *init_local;
  
  vkb::InstanceBuilder::InstanceBuilder((InstanceBuilder *)&instance_ret.m_init);
  pIVar8 = vkb::InstanceBuilder::use_default_debug_messenger
                     ((InstanceBuilder *)&instance_ret.m_init);
  pIVar8 = vkb::InstanceBuilder::request_validation_layers(pIVar8,true);
  pIVar8 = vkb::InstanceBuilder::set_headless(pIVar8,true);
  vkb::InstanceBuilder::build((Result<vkb::Instance> *)local_140,pIVar8);
  bVar7 = vkb::Result::operator_cast_to_bool((Result *)local_140);
  if (bVar7) {
    __writefds = vkb::Result<vkb::Instance>::value((Result<vkb::Instance> *)local_140);
    bVar7 = __writefds->properties2_ext_enabled;
    (init->instance).headless = __writefds->headless;
    (init->instance).properties2_ext_enabled = bVar7;
    pVVar1 = __writefds->instance;
    pVVar2 = __writefds->debug_messenger;
    pVVar3 = __writefds->allocation_callbacks;
    p_Var4 = __writefds->fp_vkGetInstanceProcAddr;
    uVar5 = __writefds->instance_version;
    uVar6 = __writefds->api_version;
    (init->instance).fp_vkGetDeviceProcAddr = __writefds->fp_vkGetDeviceProcAddr;
    (init->instance).instance_version = uVar5;
    (init->instance).api_version = uVar6;
    (init->instance).allocation_callbacks = pVVar3;
    (init->instance).fp_vkGetInstanceProcAddr = p_Var4;
    (init->instance).instance = pVVar1;
    (init->instance).debug_messenger = pVVar2;
    vkb::Instance::make_table
              ((InstanceDispatchTable *)&phys_device_selector.criteria.defer_surface_initialization,
               &init->instance);
    memcpy(&init->inst_disp,&phys_device_selector.criteria.defer_surface_initialization,0x379);
    vkb::PhysicalDeviceSelector::PhysicalDeviceSelector
              ((PhysicalDeviceSelector *)&phys_device_ret.m_init,&init->instance);
    vkb::PhysicalDeviceSelector::select
              ((PhysicalDeviceSelector *)local_e28,(int)&phys_device_ret + 0x6c0,__readfds,
               (fd_set *)__writefds,in_R8,in_R9);
    bVar7 = vkb::Result::operator_cast_to_bool((Result *)local_e28);
    if (bVar7) {
      pPVar10 = vkb::Result<vkb::PhysicalDevice>::value((Result<vkb::PhysicalDevice> *)local_e28);
      vkb::PhysicalDevice::PhysicalDevice
                ((PhysicalDevice *)&device_builder.info.allocation_callbacks,pPVar10);
      vkb::PhysicalDevice::PhysicalDevice
                ((PhysicalDevice *)&device_ret.m_init,
                 (PhysicalDevice *)&device_builder.info.allocation_callbacks);
      vkb::DeviceBuilder::DeviceBuilder
                ((DeviceBuilder *)local_1c18,(PhysicalDevice *)&device_ret.m_init);
      vkb::PhysicalDevice::~PhysicalDevice((PhysicalDevice *)&device_ret.m_init);
      vkb::DeviceBuilder::build((Result<vkb::Device> *)local_29f0,(DeviceBuilder *)local_1c18);
      bVar7 = vkb::Result::operator_cast_to_bool((Result *)local_29f0);
      if (bVar7) {
        pDVar11 = vkb::Result<vkb::Device>::value((Result<vkb::Device> *)local_29f0);
        vkb::Device::operator=(&init->device,pDVar11);
        vkb::Device::make_table(&local_3da8,&init->device);
        memcpy(&init->disp,&local_3da8,0x1381);
        init_local._4_4_ = 0;
      }
      else {
        eVar12 = vkb::Result<vkb::Device>::error((Result<vkb::Device> *)local_29f0);
        local_2a20._M_cat = eVar12._M_cat;
        local_2a20._M_value = eVar12._M_value;
        std::error_code::message_abi_cxx11_(&local_2a10,&local_2a20);
        poVar9 = std::operator<<((ostream *)&std::cout,(string *)&local_2a10);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&local_2a10);
        init_local._4_4_ = -1;
      }
      vkb::Result<vkb::Device>::~Result((Result<vkb::Device> *)local_29f0);
      vkb::DeviceBuilder::~DeviceBuilder((DeviceBuilder *)local_1c18);
      vkb::PhysicalDevice::~PhysicalDevice
                ((PhysicalDevice *)&device_builder.info.allocation_callbacks);
    }
    else {
      eVar12 = vkb::Result<vkb::PhysicalDevice>::error((Result<vkb::PhysicalDevice> *)local_e28);
      physical_device._1720_4_ = eVar12._M_value;
      std::error_code::message_abi_cxx11_
                (&local_e48,(error_code *)&physical_device.defer_surface_initialization);
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&local_e48);
      std::operator<<(poVar9,"\n");
      std::__cxx11::string::~string((string *)&local_e48);
      init_local._4_4_ = -1;
    }
    vkb::Result<vkb::PhysicalDevice>::~Result((Result<vkb::PhysicalDevice> *)local_e28);
    vkb::PhysicalDeviceSelector::~PhysicalDeviceSelector
              ((PhysicalDeviceSelector *)&phys_device_ret.m_init);
  }
  else {
    eVar12 = vkb::Result<vkb::Instance>::error((Result<vkb::Instance> *)local_140);
    local_180._M_cat = eVar12._M_cat;
    local_180._M_value = eVar12._M_value;
    std::error_code::message_abi_cxx11_(&local_170,&local_180);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&local_170);
    std::operator<<(poVar9,"\n");
    std::__cxx11::string::~string((string *)&local_170);
    init_local._4_4_ = -1;
  }
  vkb::Result<vkb::Instance>::~Result((Result<vkb::Instance> *)local_140);
  vkb::InstanceBuilder::~InstanceBuilder((InstanceBuilder *)&instance_ret.m_init);
  return init_local._4_4_;
}

Assistant:

int device_initialization(Init& init) {
    vkb::InstanceBuilder instance_builder;
    auto instance_ret = instance_builder.use_default_debug_messenger()
                            .request_validation_layers()
                            .set_headless() // Skip vk-bootstrap trying to create WSI for you
                            .build();
    if (!instance_ret) {
        std::cout << instance_ret.error().message() << "\n";
        return -1;
    }
    init.instance = instance_ret.value();

    init.inst_disp = init.instance.make_table();

    vkb::PhysicalDeviceSelector phys_device_selector(init.instance);
    auto phys_device_ret = phys_device_selector.select();
    if (!phys_device_ret) {
        std::cout << phys_device_ret.error().message() << "\n";
        return -1;
    }
    vkb::PhysicalDevice physical_device = phys_device_ret.value();

    vkb::DeviceBuilder device_builder{ physical_device };
    auto device_ret = device_builder.build();
    if (!device_ret) {
        std::cout << device_ret.error().message() << "\n";
        return -1;
    }
    init.device = device_ret.value();

    init.disp = init.device.make_table();

    return 0;
}